

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<std::vector<char,_std::allocator<char>_>_> *
wasm::WATParser::datastring<wasm::WATParser::ParseDeclsCtx>
          (Result<std::vector<char,_std::allocator<char>_>_> *__return_storage_ptr__,
          ParseDeclsCtx *ctx)

{
  undefined1 uVar1;
  undefined1 local_70 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  vector<char,_std::allocator<char>_> data;
  
  str.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  str.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._33_7_ = 0;
  do {
    Lexer::takeString_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,&ctx->in);
    uVar1 = str.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_1_;
    if (str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ != '\0') {
      std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                ((vector<char,std::allocator<char>> *)
                 &str.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged,0,local_70,
                 (pointer)((long)str.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._M_value._M_dataplus._M_p + (long)local_70));
    }
    if (str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ == '\x01') {
      str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = 0;
      if (local_70 !=
          (undefined1  [8])
          ((long)&str.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload + 8)) {
        operator_delete((void *)local_70,
                        str.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length + 1);
      }
    }
  } while (uVar1 != '\0');
  *(undefined8 *)
   &(__return_storage_ptr__->val).
    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
    super__Move_assign_alias<std::vector<char>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<char>,_wasm::Err> =
       str.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._32_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::Err> + 8) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::Err> + 0x10) = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::DataStringT> datastring(Ctx& ctx) {
  auto data = ctx.makeDataString();
  while (auto str = ctx.in.takeString()) {
    ctx.appendDataString(data, *str);
  }
  return data;
}